

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdcoefct.c
# Opt level: O0

int decompress_smooth_data(j_decompress_ptr cinfo,JSAMPIMAGE output_buf)

{
  JDIMENSION JVar1;
  int iVar2;
  jpeg_d_coef_controller *pjVar3;
  _func_void_j_decompress_ptr *p_Var4;
  ushort *puVar5;
  inverse_DCT_method_ptr p_Var6;
  int iVar7;
  uint uVar8;
  JBLOCKARRAY ppaJVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  long lVar16;
  byte bVar17;
  bool bVar18;
  bool bVar19;
  int local_18c;
  JDIMENSION delta;
  int pred;
  int Al;
  int DC9;
  int DC8;
  int DC7;
  int DC6;
  int DC5;
  int DC4;
  int DC3;
  int DC2;
  int DC1;
  INT32 num;
  INT32 Q20;
  INT32 Q11;
  INT32 Q10;
  INT32 Q02;
  INT32 Q01;
  INT32 Q00;
  JQUANT_TBL *quanttbl;
  int *coef_bits;
  JBLOCK workspace;
  boolean last_row;
  boolean first_row;
  inverse_DCT_method_ptr inverse_DCT;
  jpeg_component_info *compptr;
  JSAMPARRAY ppJStack_70;
  JDIMENSION output_col;
  JSAMPARRAY output_ptr;
  JBLOCKROW next_block_row;
  JBLOCKROW prev_block_row;
  JBLOCKROW buffer_ptr;
  JBLOCKARRAY buffer;
  uint local_40;
  int access_rows;
  int block_rows;
  int block_row;
  int ci;
  JDIMENSION last_block_column;
  JDIMENSION block_num;
  JDIMENSION last_iMCU_row;
  my_coef_ptr coef;
  JSAMPIMAGE output_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->coef;
  JVar1 = cinfo->total_iMCU_rows;
  while( true ) {
    bVar18 = false;
    if (cinfo->input_scan_number <= cinfo->output_scan_number) {
      bVar18 = cinfo->inputctl->eoi_reached == 0;
    }
    if ((!bVar18) ||
       ((cinfo->input_scan_number == cinfo->output_scan_number &&
        (cinfo->output_iMCU_row + (uint)(cinfo->Ss == 0) < cinfo->input_iMCU_row)))) break;
    iVar7 = (*cinfo->inputctl->consume_input)(cinfo);
    if (iVar7 == 0) {
      return 0;
    }
  }
  block_rows = 0;
  inverse_DCT = (inverse_DCT_method_ptr)cinfo->comp_info;
  for (; block_rows < cinfo->num_components; block_rows = block_rows + 1) {
    if (*(int *)(inverse_DCT + 0x34) != 0) {
      if (cinfo->output_iMCU_row < JVar1 - 1) {
        local_40 = *(uint *)(inverse_DCT + 0xc);
        buffer._4_4_ = local_40 << 1;
        bVar18 = false;
      }
      else {
        local_40 = *(uint *)(inverse_DCT + 0x20) % *(uint *)(inverse_DCT + 0xc);
        if (local_40 == 0) {
          local_40 = *(uint *)(inverse_DCT + 0xc);
        }
        buffer._4_4_ = local_40;
        bVar18 = true;
      }
      bVar19 = cinfo->output_iMCU_row == 0;
      if (bVar19) {
        buffer_ptr = (JBLOCKROW)
                     (*cinfo->mem->access_virt_barray)
                               ((j_common_ptr)cinfo,
                                (jvirt_barray_ptr)(&pjVar3[3].start_output_pass)[block_rows],0,
                                buffer._4_4_,0);
      }
      else {
        ppaJVar9 = (*cinfo->mem->access_virt_barray)
                             ((j_common_ptr)cinfo,
                              (jvirt_barray_ptr)(&pjVar3[3].start_output_pass)[block_rows],
                              (cinfo->output_iMCU_row - 1) * *(int *)(inverse_DCT + 0xc),
                              *(int *)(inverse_DCT + 0xc) + buffer._4_4_,0);
        buffer_ptr = (JBLOCKROW)(ppaJVar9 + *(int *)(inverse_DCT + 0xc));
      }
      p_Var4 = pjVar3[5].start_output_pass;
      puVar5 = *(ushort **)(inverse_DCT + 0x50);
      uVar10 = (ulong)*puVar5;
      uVar11 = (ulong)puVar5[1];
      uVar12 = (ulong)puVar5[8];
      uVar13 = (ulong)puVar5[0x10];
      uVar14 = (ulong)puVar5[9];
      uVar15 = (ulong)puVar5[2];
      p_Var6 = cinfo->idct->inverse_DCT[block_rows];
      ppJStack_70 = output_buf[block_rows];
      for (access_rows = 0; access_rows < (int)local_40; access_rows = access_rows + 1) {
        prev_block_row = *(JBLOCKROW *)(*buffer_ptr + (long)access_rows * 4);
        if ((!bVar19) || (next_block_row = prev_block_row, access_rows != 0)) {
          next_block_row = *(JBLOCKROW *)(*buffer_ptr + (long)(access_rows + -1) * 4);
        }
        if ((!bVar18) || (output_ptr = (JSAMPARRAY)prev_block_row, access_rows != local_40 - 1)) {
          output_ptr = *(JSAMPARRAY *)(*buffer_ptr + (long)(access_rows + 1) * 4);
        }
        DC4 = (int)(*next_block_row)[0];
        DC7 = (int)(*prev_block_row)[0];
        Al = (int)*(short *)output_ptr;
        compptr._4_4_ = 0;
        iVar7 = *(int *)(inverse_DCT + 0x1c);
        DC9 = Al;
        DC6 = DC7;
        DC3 = DC4;
        for (ci = 0; (uint)ci <= iVar7 - 1U; ci = ci + 1) {
          jcopy_block_row(prev_block_row,(JBLOCKROW)&coef_bits,1);
          pred = Al;
          DC8 = DC7;
          DC5 = DC4;
          if ((uint)ci < iVar7 - 1U) {
            DC5 = (int)next_block_row[1][0];
            DC8 = (int)prev_block_row[1][0];
            pred = (int)*(short *)(output_ptr + 0x10);
          }
          iVar2 = *(int *)(p_Var4 + (long)(block_rows * 6) * 4 + 4);
          if ((iVar2 != 0) && (coef_bits._2_2_ == 0)) {
            lVar16 = uVar10 * 0x24 * (long)(DC6 - DC8);
            bVar17 = (byte)iVar2;
            if (lVar16 < 0) {
              local_18c = (int)((long)(uVar11 * 0x80 - lVar16) / (long)(uVar11 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
              local_18c._0_2_ = -(short)local_18c;
            }
            else {
              local_18c = (int)((long)(uVar11 * 0x80 + lVar16) / (long)(uVar11 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
            }
            coef_bits._2_2_ = (short)local_18c;
          }
          iVar2 = *(int *)(p_Var4 + (long)(block_rows * 6) * 4 + 8);
          if ((iVar2 != 0) && (workspace[4] == 0)) {
            lVar16 = uVar10 * 0x24 * (long)(DC4 - Al);
            bVar17 = (byte)iVar2;
            if (lVar16 < 0) {
              local_18c = (int)((long)(uVar12 * 0x80 - lVar16) / (long)(uVar12 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
              local_18c._0_2_ = -(short)local_18c;
            }
            else {
              local_18c = (int)((long)(uVar12 * 0x80 + lVar16) / (long)(uVar12 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
            }
            workspace[4] = (short)local_18c;
          }
          iVar2 = *(int *)(p_Var4 + (long)(block_rows * 6) * 4 + 0xc);
          if ((iVar2 != 0) && (workspace[0xc] == 0)) {
            lVar16 = uVar10 * 9 * (long)(DC4 + Al + DC7 * -2);
            bVar17 = (byte)iVar2;
            if (lVar16 < 0) {
              local_18c = (int)((long)(uVar13 * 0x80 - lVar16) / (long)(uVar13 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
              local_18c._0_2_ = -(short)local_18c;
            }
            else {
              local_18c = (int)((long)(uVar13 * 0x80 + lVar16) / (long)(uVar13 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
            }
            workspace[0xc] = (short)local_18c;
          }
          iVar2 = *(int *)(p_Var4 + (long)(block_rows * 6) * 4 + 0x10);
          if ((iVar2 != 0) && (workspace[5] == 0)) {
            lVar16 = uVar10 * 5 * (long)(((DC3 - DC5) - DC9) + pred);
            bVar17 = (byte)iVar2;
            if (lVar16 < 0) {
              local_18c = (int)((long)(uVar14 * 0x80 - lVar16) / (long)(uVar14 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
              local_18c._0_2_ = -(short)local_18c;
            }
            else {
              local_18c = (int)((long)(uVar14 * 0x80 + lVar16) / (long)(uVar14 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
            }
            workspace[5] = (short)local_18c;
          }
          iVar2 = *(int *)(p_Var4 + (long)(block_rows * 6) * 4 + 0x14);
          if ((iVar2 != 0) && (coef_bits._4_2_ == 0)) {
            lVar16 = uVar10 * 9 * (long)(DC6 + DC8 + DC7 * -2);
            bVar17 = (byte)iVar2;
            if (lVar16 < 0) {
              local_18c = (int)((long)(uVar15 * 0x80 - lVar16) / (long)(uVar15 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
              local_18c._0_2_ = -(short)local_18c;
            }
            else {
              local_18c = (int)((long)(uVar15 * 0x80 + lVar16) / (long)(uVar15 << 8));
              if ((0 < iVar2) && (1 << (bVar17 & 0x1f) <= local_18c)) {
                local_18c = (1 << (bVar17 & 0x1f)) + -1;
              }
            }
            coef_bits._4_2_ = (short)local_18c;
          }
          (*p_Var6)(cinfo,(jpeg_component_info *)inverse_DCT,(JCOEFPTR)&coef_bits,ppJStack_70,
                    compptr._4_4_);
          DC3 = DC4;
          DC4 = DC5;
          DC6 = DC7;
          DC7 = DC8;
          DC9 = Al;
          Al = pred;
          prev_block_row = prev_block_row + 1;
          next_block_row = next_block_row + 1;
          output_ptr = output_ptr + 0x10;
          compptr._4_4_ = *(int *)(inverse_DCT + 0x24) + compptr._4_4_;
        }
        ppJStack_70 = ppJStack_70 + *(int *)(inverse_DCT + 0x28);
      }
    }
    inverse_DCT = inverse_DCT + 0x60;
  }
  uVar8 = cinfo->output_iMCU_row + 1;
  cinfo->output_iMCU_row = uVar8;
  if (uVar8 < cinfo->total_iMCU_rows) {
    return 3;
  }
  return 4;
}

Assistant:

METHODDEF(int)
decompress_smooth_data (j_decompress_ptr cinfo, JSAMPIMAGE output_buf)
{
  my_coef_ptr coef = (my_coef_ptr) cinfo->coef;
  JDIMENSION last_iMCU_row = cinfo->total_iMCU_rows - 1;
  JDIMENSION block_num, last_block_column;
  int ci, block_row, block_rows, access_rows;
  JBLOCKARRAY buffer;
  JBLOCKROW buffer_ptr, prev_block_row, next_block_row;
  JSAMPARRAY output_ptr;
  JDIMENSION output_col;
  jpeg_component_info *compptr;
  inverse_DCT_method_ptr inverse_DCT;
  boolean first_row, last_row;
  JBLOCK workspace;
  int *coef_bits;
  JQUANT_TBL *quanttbl;
  INT32 Q00,Q01,Q02,Q10,Q11,Q20, num;
  int DC1,DC2,DC3,DC4,DC5,DC6,DC7,DC8,DC9;
  int Al, pred;

  /* Force some input to be done if we are getting ahead of the input. */
  while (cinfo->input_scan_number <= cinfo->output_scan_number &&
	 ! cinfo->inputctl->eoi_reached) {
    if (cinfo->input_scan_number == cinfo->output_scan_number) {
      /* If input is working on current scan, we ordinarily want it to
       * have completed the current row.  But if input scan is DC,
       * we want it to keep one row ahead so that next block row's DC
       * values are up to date.
       */
      JDIMENSION delta = (cinfo->Ss == 0) ? 1 : 0;
      if (cinfo->input_iMCU_row > cinfo->output_iMCU_row+delta)
	break;
    }
    if ((*cinfo->inputctl->consume_input)(cinfo) == JPEG_SUSPENDED)
      return JPEG_SUSPENDED;
  }

  /* OK, output from the virtual arrays. */
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    /* Don't bother to IDCT an uninteresting component. */
    if (! compptr->component_needed)
      continue;
    /* Count non-dummy DCT block rows in this iMCU row. */
    if (cinfo->output_iMCU_row < last_iMCU_row) {
      block_rows = compptr->v_samp_factor;
      access_rows = block_rows * 2; /* this and next iMCU row */
      last_row = FALSE;
    } else {
      /* NB: can't use last_row_height here; it is input-side-dependent! */
      block_rows = (int) (compptr->height_in_blocks % compptr->v_samp_factor);
      if (block_rows == 0) block_rows = compptr->v_samp_factor;
      access_rows = block_rows; /* this iMCU row only */
      last_row = TRUE;
    }
    /* Align the virtual buffer for this component. */
    if (cinfo->output_iMCU_row > 0) {
      access_rows += compptr->v_samp_factor; /* prior iMCU row too */
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (cinfo->output_iMCU_row - 1) * compptr->v_samp_factor,
	 (JDIMENSION) access_rows, FALSE);
      buffer += compptr->v_samp_factor;	/* point to current iMCU row */
      first_row = FALSE;
    } else {
      buffer = (*cinfo->mem->access_virt_barray)
	((j_common_ptr) cinfo, coef->whole_image[ci],
	 (JDIMENSION) 0, (JDIMENSION) access_rows, FALSE);
      first_row = TRUE;
    }
    /* Fetch component-dependent info */
    coef_bits = coef->coef_bits_latch + (ci * SAVED_COEFS);
    quanttbl = compptr->quant_table;
    Q00 = quanttbl->quantval[0];
    Q01 = quanttbl->quantval[Q01_POS];
    Q10 = quanttbl->quantval[Q10_POS];
    Q20 = quanttbl->quantval[Q20_POS];
    Q11 = quanttbl->quantval[Q11_POS];
    Q02 = quanttbl->quantval[Q02_POS];
    inverse_DCT = cinfo->idct->inverse_DCT[ci];
    output_ptr = output_buf[ci];
    /* Loop over all DCT blocks to be processed. */
    for (block_row = 0; block_row < block_rows; block_row++) {
      buffer_ptr = buffer[block_row];
      if (first_row && block_row == 0)
	prev_block_row = buffer_ptr;
      else
	prev_block_row = buffer[block_row-1];
      if (last_row && block_row == block_rows-1)
	next_block_row = buffer_ptr;
      else
	next_block_row = buffer[block_row+1];
      /* We fetch the surrounding DC values using a sliding-register approach.
       * Initialize all nine here so as to do the right thing on narrow pics.
       */
      DC1 = DC2 = DC3 = (int) prev_block_row[0][0];
      DC4 = DC5 = DC6 = (int) buffer_ptr[0][0];
      DC7 = DC8 = DC9 = (int) next_block_row[0][0];
      output_col = 0;
      last_block_column = compptr->width_in_blocks - 1;
      for (block_num = 0; block_num <= last_block_column; block_num++) {
	/* Fetch current DCT block into workspace so we can modify it. */
	jcopy_block_row(buffer_ptr, (JBLOCKROW) workspace, (JDIMENSION) 1);
	/* Update DC values */
	if (block_num < last_block_column) {
	  DC3 = (int) prev_block_row[1][0];
	  DC6 = (int) buffer_ptr[1][0];
	  DC9 = (int) next_block_row[1][0];
	}
	/* Compute coefficient estimates per K.8.
	 * An estimate is applied only if coefficient is still zero,
	 * and is not known to be fully accurate.
	 */
	/* AC01 */
	if ((Al=coef_bits[1]) != 0 && workspace[1] == 0) {
	  num = 36 * Q00 * (DC4 - DC6);
	  if (num >= 0) {
	    pred = (int) (((Q01<<7) + num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q01<<7) - num) / (Q01<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[1] = (JCOEF) pred;
	}
	/* AC10 */
	if ((Al=coef_bits[2]) != 0 && workspace[8] == 0) {
	  num = 36 * Q00 * (DC2 - DC8);
	  if (num >= 0) {
	    pred = (int) (((Q10<<7) + num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q10<<7) - num) / (Q10<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[8] = (JCOEF) pred;
	}
	/* AC20 */
	if ((Al=coef_bits[3]) != 0 && workspace[16] == 0) {
	  num = 9 * Q00 * (DC2 + DC8 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q20<<7) + num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q20<<7) - num) / (Q20<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[16] = (JCOEF) pred;
	}
	/* AC11 */
	if ((Al=coef_bits[4]) != 0 && workspace[9] == 0) {
	  num = 5 * Q00 * (DC1 - DC3 - DC7 + DC9);
	  if (num >= 0) {
	    pred = (int) (((Q11<<7) + num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q11<<7) - num) / (Q11<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[9] = (JCOEF) pred;
	}
	/* AC02 */
	if ((Al=coef_bits[5]) != 0 && workspace[2] == 0) {
	  num = 9 * Q00 * (DC4 + DC6 - 2*DC5);
	  if (num >= 0) {
	    pred = (int) (((Q02<<7) + num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	  } else {
	    pred = (int) (((Q02<<7) - num) / (Q02<<8));
	    if (Al > 0 && pred >= (1<<Al))
	      pred = (1<<Al)-1;
	    pred = -pred;
	  }
	  workspace[2] = (JCOEF) pred;
	}
	/* OK, do the IDCT */
	(*inverse_DCT) (cinfo, compptr, (JCOEFPTR) workspace,
			output_ptr, output_col);
	/* Advance for next column */
	DC1 = DC2; DC2 = DC3;
	DC4 = DC5; DC5 = DC6;
	DC7 = DC8; DC8 = DC9;
	buffer_ptr++, prev_block_row++, next_block_row++;
	output_col += compptr->DCT_h_scaled_size;
      }
      output_ptr += compptr->DCT_v_scaled_size;
    }
  }

  if (++(cinfo->output_iMCU_row) < cinfo->total_iMCU_rows)
    return JPEG_ROW_COMPLETED;
  return JPEG_SCAN_COMPLETED;
}